

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O0

void __thiscall
onmt::SentencePieceLearner::learn
          (SentencePieceLearner *this,string *model_path,char *param_3,bool verbose)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *__new;
  byte in_CL;
  long in_RDI;
  string sp_vocab_path;
  string sp_model_path;
  string *in_stack_00000110;
  SentenceIterator *in_stack_00000118;
  string_view in_stack_00000120;
  Status status;
  pointer in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined6 in_stack_fffffffffffffeb0;
  byte bVar4;
  undefined1 in_stack_fffffffffffffeb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  Status *in_stack_fffffffffffffec8;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  undefined1 local_38 [16];
  byte local_19;
  
  bVar4 = 1;
  if ((in_CL & 1) == 0) {
    bVar4 = *(byte *)(in_RDI + 8);
  }
  local_19 = bVar4 & 1;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      *)0x3bd43e);
  if (bVar1) {
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::operator->((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                  *)0x3bd452);
    std::ostream::flush();
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::reset((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  if ((local_19 & 1) == 0) {
    std::ios::setstate((int)*(undefined8 *)(std::cerr + -0x18) + 0x70f950);
  }
  std::operator+(in_stack_fffffffffffffeb8,
                 (char *)CONCAT17(in_stack_fffffffffffffeb7,
                                  CONCAT16(bVar4,in_stack_fffffffffffffeb0)));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (char *)in_stack_fffffffffffffe90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
  sentencepiece::SentencePieceTrainer::Train(in_stack_00000120,in_stack_00000118,in_stack_00000110);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  if ((local_19 & 1) == 0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x70f950);
  }
  if ((*(byte *)(in_RDI + 0x70) & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
  }
  std::operator+(in_stack_fffffffffffffeb8,
                 (char *)CONCAT17(in_stack_fffffffffffffeb7,
                                  CONCAT16(bVar4,in_stack_fffffffffffffeb0)));
  std::operator+(in_stack_fffffffffffffeb8,
                 (char *)CONCAT17(in_stack_fffffffffffffeb7,
                                  CONCAT16(bVar4,in_stack_fffffffffffffeb0)));
  uVar2 = sentencepiece::util::Status::ok((Status *)0x3bd6c5);
  if ((bool)uVar2) {
    if ((*(byte *)(in_RDI + 0x60) & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      __new = (char *)std::__cxx11::string::c_str();
      rename(pcVar3,__new);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      remove(pcVar3);
    }
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e8);
    sentencepiece::util::Status::~Status((Status *)0x3bd87b);
    return;
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  remove(pcVar3);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  remove(pcVar3);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  sentencepiece::util::Status::ToString_abi_cxx11_(in_stack_fffffffffffffec8);
  std::operator+((char *)CONCAT17(uVar2,in_stack_fffffffffffffe98),__rhs);
  std::runtime_error::runtime_error((runtime_error *)__rhs,local_128);
  __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SentencePieceLearner::learn(const std::string& model_path, const char*, bool verbose)
  {
    verbose = verbose || _verbose;
    if (_input_stream) {
      _input_stream->flush();
      _input_stream.reset();  // Freeze the input file for training.
    }

    if (!verbose)
      std::cerr.setstate(std::ios_base::failbit);
    auto status = sentencepiece::SentencePieceTrainer::Train(_args
                                                             + " --input=" + _input_filename
                                                             + " --model_prefix=" + model_path);
    if (!verbose)
      std::cerr.clear();

    // Cleanup the input file.
    if (!_keep_input_file) { remove(_input_filename.c_str()); }

    std::string sp_model_path = model_path + ".model";
    std::string sp_vocab_path = model_path + ".vocab";

    if (!status.ok())
    {
      // Cleanup the output files on error.
      remove(sp_model_path.c_str());
      remove(sp_vocab_path.c_str());
      throw std::runtime_error("SentencePieceTrainer: " + status.ToString());
    }
    else if (!_keep_vocab)
    {
      // Remove the generated vocabulary and move the model to the request path.
      rename(sp_model_path.c_str(), model_path.c_str());
      remove(sp_vocab_path.c_str());
    }
  }